

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

ParseTokenKind __thiscall
TTD::TextFormatReader::ScanKey
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  int iVar1;
  bool bVar2;
  char16 local_2a [4];
  char16 c;
  
  (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count = 0;
  local_2a[0] = L'\0';
  do {
    iVar1 = (this->super_FileReader).m_peekChar;
    if (iVar1 == -1) {
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
      if (!bVar2) {
LAB_00917fcf:
        while( true ) {
          iVar1 = (this->super_FileReader).m_peekChar;
          if (iVar1 == -1) {
            bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
            if (!bVar2) {
              return Error;
            }
            (this->super_FileReader).m_peekChar = (uint)(ushort)local_2a[0];
          }
          else {
            local_2a[0] = (char16)iVar1;
          }
          if (local_2a[0] == L'\0') {
            return Error;
          }
          if (0x100 < (charList->
                      super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count) {
            return Error;
          }
          if (local_2a[0] == L':') break;
          FileReader::ReadRawChar(&this->super_FileReader,local_2a);
          JsUtil::
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
          EnsureArray(charList,0);
          iVar1 = (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).
                  count;
          (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).buffer
          [iVar1] = local_2a[0];
          (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count =
               iVar1 + 1;
        }
        return String;
      }
      (this->super_FileReader).m_peekChar = (uint)(ushort)local_2a[0];
    }
    else {
      local_2a[0] = (char16)iVar1;
    }
    if ((0x20 < (ulong)(ushort)local_2a[0]) ||
       ((0x100002600U >> ((ulong)(ushort)local_2a[0] & 0x3f) & 1) == 0)) goto LAB_00917fcf;
    FileReader::ReadRawChar(&this->super_FileReader,local_2a);
  } while( true );
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanKey(JsUtil::List<char16, HeapAllocator>& charList)
    {
        charList.Clear();

        char16 c = _u('\0');
        bool endFound = false;

        //Read off any whitespace
        while(this->PeekRawChar(&c))
        {
            if((c != _u('\t')) & (c != _u('\r')) & (c != _u('\n')) & (c != _u(' ')))
            {
                break;
            }

            this->ReadRawChar(&c);
        }

        while(this->PeekRawChar(&c))
        {
            if(c == 0 || charList.Count() > 256)
            {
                //we reached the end of the file or the "key" is much longer than it should be
                return NSTokens::ParseTokenKind::Error;
            }

            if(c == _u(':'))
            {
                //end of the string
                endFound = true;
                break;
            }
            else
            {
                this->ReadRawChar(&c);
                charList.Add(c);
            }
        }

        if(!endFound)
        {
            // no ending found
            return NSTokens::ParseTokenKind::Error;
        }

        return NSTokens::ParseTokenKind::String;
    }